

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<wasm::Type> *
wasm::WATParser::tupletype<wasm::WATParser::ParseImplicitTypeDefsCtx>
          (MaybeResult<wasm::Type> *__return_storage_ptr__,ParseImplicitTypeDefsCtx *ctx)

{
  pointer *this;
  pointer pTVar1;
  undefined1 uVar2;
  bool bVar3;
  __index_type _Var4;
  string_view expected;
  undefined1 local_f8 [8];
  Result<wasm::Type> _val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  Lexer *local_90;
  ParseImplicitTypeDefsCtx *local_88;
  ulong local_80;
  undefined1 auStack_78 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> elems;
  Result<wasm::Type> elem;
  
  local_90 = &ctx->in;
  expected._M_str = "tuple";
  expected._M_len = 5;
  local_88 = ctx;
  bVar3 = Lexer::takeSExprStart(local_90,expected);
  if (bVar3) {
    auStack_78 = (undefined1  [8])0x0;
    elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ =
         (long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                .super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x10;
    local_80 = 0;
    this = &elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    do {
      bVar3 = Lexer::takeRParen(local_90);
      if (bVar3) {
        if (local_80 < 2) {
          _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = &local_c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                     "tuples must have at least two elements","");
          Lexer::err((Err *)&elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,local_90,
                     (string *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> =
               elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
          pTVar1 = (pointer)((long)&elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 8);
          if (elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == pTVar1) {
            *(ulong *)elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ =
                 CONCAT71(elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._9_7_,
                          elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_);
            *(undefined8 *)
             (elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ + 8) =
                 elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(pointer *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> =
                 elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x10
                      ) = CONCAT71(elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._9_7_,
                                   elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_);
          }
          ((_Uninitialized<wasm::Type,_true> *)
          ((long)&(__return_storage_ptr__->val).
                  super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 8))->_M_storage
               = (Type)elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.
                       id;
          elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id =
               (_Uninitialized<wasm::Type,_true>)(Type)0x0;
          elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pTVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ != &local_c0) {
            operator_delete((void *)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,
                            local_c0._M_allocated_capacity + 1);
          }
        }
        else {
          TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::makeTupleType
                    ((Result<wasm::Type> *)
                     &elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     &local_88->super_TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>,
                     (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_78);
          if (elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> =
                 elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
            _Var4 = '\x02';
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,
                       elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                       (long)&(elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage)->id +
                       (long)elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                             _M_storage.id);
          }
          else {
            *(pointer *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> =
                 elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            _Var4 = '\0';
          }
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20) = _Var4;
          std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                            &elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        break;
      }
      singlevaltype<wasm::WATParser::ParseImplicitTypeDefsCtx>((Result<wasm::Type> *)this,local_88);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_f8,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)this);
      uVar2 = _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_;
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        local_b0 = &local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_f8,
                   (long)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                         _M_storage.id + (long)local_f8);
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> =
             elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
        if (local_b0 == &local_a0) {
          *(ulong *)elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ =
               CONCAT71(uStack_9f,local_a0);
          *(undefined8 *)
           (elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ + 8) = uStack_98;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> = local_b0;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x10)
               = CONCAT71(uStack_9f,local_a0);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 8) = local_a8;
        local_a8 = 0;
        local_a0 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        local_b0 = &local_a0;
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_f8);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_f8);
        local_f8 = (undefined1  [8])
                   elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        if (elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_78,
                     (iterator)
                     elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,(Type *)local_f8);
        }
        else {
          (elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id =
               (uintptr_t)
               elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        local_80 = local_80 + 1;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)this);
    } while (uVar2 != '\x01');
    if (auStack_78 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_78,
                      (long)elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
    }
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::TypeT> tupletype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("tuple"sv)) {
    return {};
  }
  auto elems = ctx.makeTupleElemList();
  size_t numElems = 0;
  while (!ctx.in.takeRParen()) {
    auto elem = singlevaltype(ctx);
    CHECK_ERR(elem);
    ctx.appendTupleElem(elems, *elem);
    ++numElems;
  }
  if (numElems < 2) {
    return ctx.in.err("tuples must have at least two elements");
  }
  return ctx.makeTupleType(elems);
}